

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsModule.cpp
# Opt level: O3

void __thiscall Js::AsmJsModuleCompiler::RevertFunction(AsmJsModuleCompiler *this,int funcIndex)

{
  undefined1 *puVar1;
  Type pAVar2;
  FunctionBody *this_00;
  Type *ppAVar3;
  ProxyEntryPointInfo *pPVar4;
  
  ppAVar3 = JsUtil::
            List<Js::AsmJsFunc_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ::Item(&this->mFunctionArray,funcIndex);
  pAVar2 = *ppAVar3;
  this_00 = pAVar2->mFuncBody;
  FunctionBody::ResetByteCodeGenState(this_00);
  FunctionBody::AddDeferParseAttribute(this_00);
  puVar1 = &(this_00->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45;
  *puVar1 = *puVar1 & 0xfd;
  FunctionBody::ResetEntryPoint(this_00);
  pPVar4 = FunctionProxy::GetDefaultEntryPointInfo((FunctionProxy *)this_00);
  pPVar4->jsMethod = (Type)this->mCx->scriptContext->DeferredParsingThunk;
  puVar1 = &(this_00->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46;
  *puVar1 = *puVar1 & 0xf9;
  pAVar2->mFncNode->funcInfo->byteCodeFunction = &pAVar2->mFuncBody->super_ParseableFunctionInfo;
  return;
}

Assistant:

void AsmJsModuleCompiler::RevertFunction(int funcIndex)
    {
        AsmJsFunc* func = mFunctionArray.Item(funcIndex);
        FunctionBody * funcBody = func->GetFuncBody();
        funcBody->ResetByteCodeGenState();
        funcBody->AddDeferParseAttribute();
        funcBody->SetFunctionParsed(false);
        funcBody->ResetEntryPoint();
        funcBody->SetEntryPoint(funcBody->GetDefaultEntryPointInfo(), GetScriptContext()->DeferredParsingThunk);
        funcBody->SetIsAsmjsMode(false);
        funcBody->SetIsAsmJsFunction(false);
        func->GetFncNode()->funcInfo->byteCodeFunction = func->GetFuncBody();
    }